

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

Variable __thiscall
LiteScript::_Type_CHARACTER::OAssign(_Type_CHARACTER *this,Variable *src,Variable *dest)

{
  String *pSVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  Variable tmp;
  Variable VStack_78;
  String local_68;
  String local_48;
  
  pOVar3 = Variable::operator->((Variable *)in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)_type_string);
  if (bVar2) {
    Variable::Convert(&VStack_78,in_RCX);
    pOVar3 = Variable::operator->(&VStack_78);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator!=(pTVar4,(Type *)_type_string);
    if (bVar2) {
      Variable::Variable((Variable *)this,dest);
      Variable::~Variable(&VStack_78);
      puVar5 = extraout_RDX;
      goto LAB_0012181d;
    }
    pOVar3 = Variable::operator->(&VStack_78);
    pSVar1 = (String *)pOVar3->data;
    pOVar3 = Variable::operator->(dest);
    Character::operator=(&local_48,(Character *)pOVar3->data,pSVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_48.str._M_dataplus._M_p != &local_48.str.field_2) {
      operator_delete(local_48.str._M_dataplus._M_p);
    }
    Variable::~Variable(&VStack_78);
  }
  else {
    pOVar3 = Variable::operator->((Variable *)in_RCX);
    pSVar1 = (String *)pOVar3->data;
    pOVar3 = Variable::operator->(dest);
    Character::operator=(&local_68,(Character *)pOVar3->data,pSVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_68.str._M_dataplus._M_p != &local_68.str.field_2) {
      operator_delete(local_68.str._M_dataplus._M_p);
    }
  }
  Variable::Variable((Variable *)this,dest);
  puVar5 = extraout_RDX_00;
LAB_0012181d:
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OAssign(LiteScript::Variable& src, const LiteScript::Variable& dest) const {
    if (dest->GetType() != Type::STRING) {
        Variable tmp = dest.Convert(Type::STRING);
        if (tmp->GetType() != Type::STRING)
            return Variable(src);
        src->GetData<Character>() = tmp->GetData<String>();
    }
    else {
        src->GetData<Character>() = dest->GetData<String>();
    }
    return Variable(src);
}